

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O3

int mbedtls_ripemd160_finish_ret(mbedtls_ripemd160_context *ctx,uchar *output)

{
  uint uVar1;
  int iVar2;
  uchar msglen [8];
  uchar local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  byte local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  uVar1 = ctx->total[0];
  iVar2 = ctx->total[1] << 3;
  local_1c = (byte)iVar2 | (byte)(uVar1 >> 0x1d);
  local_20 = (char)uVar1 * '\b';
  local_1f = (undefined1)(uVar1 >> 5);
  local_1e = (undefined1)(uVar1 >> 0xd);
  local_1d = (undefined1)(uVar1 >> 0x15);
  local_1b = (undefined1)((uint)iVar2 >> 8);
  local_1a = (undefined1)((uint)iVar2 >> 0x10);
  local_19 = (undefined1)((uint)iVar2 >> 0x18);
  mbedtls_ripemd160_update_ret
            (ctx,ripemd160_padding,
             (ulong)(((uint)(0x37 < (uVar1 & 0x3f)) << 6 | 0x38) - (uVar1 & 0x3f)));
  mbedtls_ripemd160_update_ret(ctx,&local_20,8);
  *output = (uchar)ctx->state[0];
  output[1] = *(uchar *)((long)ctx->state + 1);
  output[2] = *(uchar *)((long)ctx->state + 2);
  output[3] = *(uchar *)((long)ctx->state + 3);
  output[4] = (uchar)ctx->state[1];
  output[5] = *(uchar *)((long)ctx->state + 5);
  output[6] = *(uchar *)((long)ctx->state + 6);
  output[7] = *(uchar *)((long)ctx->state + 7);
  output[8] = (uchar)ctx->state[2];
  output[9] = *(uchar *)((long)ctx->state + 9);
  output[10] = *(uchar *)((long)ctx->state + 10);
  output[0xb] = *(uchar *)((long)ctx->state + 0xb);
  output[0xc] = (uchar)ctx->state[3];
  output[0xd] = *(uchar *)((long)ctx->state + 0xd);
  output[0xe] = *(uchar *)((long)ctx->state + 0xe);
  output[0xf] = *(uchar *)((long)ctx->state + 0xf);
  output[0x10] = (uchar)ctx->state[4];
  output[0x11] = *(uchar *)((long)ctx->state + 0x11);
  output[0x12] = *(uchar *)((long)ctx->state + 0x12);
  output[0x13] = *(uchar *)((long)ctx->state + 0x13);
  return 0;
}

Assistant:

int mbedtls_ripemd160_finish_ret( mbedtls_ripemd160_context *ctx,
                                  unsigned char output[20] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t last, padn;
    uint32_t high, low;
    unsigned char msglen[8];

    high = ( ctx->total[0] >> 29 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT32_LE( low,  msglen, 0 );
    PUT_UINT32_LE( high, msglen, 4 );

    last = ctx->total[0] & 0x3F;
    padn = ( last < 56 ) ? ( 56 - last ) : ( 120 - last );

    ret = mbedtls_ripemd160_update_ret( ctx, ripemd160_padding, padn );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_ripemd160_update_ret( ctx, msglen, 8 );
    if( ret != 0 )
        return( ret );

    PUT_UINT32_LE( ctx->state[0], output,  0 );
    PUT_UINT32_LE( ctx->state[1], output,  4 );
    PUT_UINT32_LE( ctx->state[2], output,  8 );
    PUT_UINT32_LE( ctx->state[3], output, 12 );
    PUT_UINT32_LE( ctx->state[4], output, 16 );

    return( 0 );
}